

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O3

void __thiscall
ncnn::Crop::resolve_crop_roi
          (Crop *this,Mat *bottom_blob,int *param_data,int *_woffset,int *_hoffset,int *_coffset,
          int *_outw,int *_outh,int *_outc)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  long lVar6;
  int *piVar7;
  
  iVar1 = bottom_blob->dims;
  lVar4 = 0xc;
  piVar5 = param_data;
  if (iVar1 != 1) {
    if (iVar1 == 2) {
      lVar6 = 0x10;
      lVar3 = 4;
      piVar2 = _outw;
      _coffset = _woffset;
      piVar5 = _outh;
      piVar7 = param_data;
    }
    else {
      if (iVar1 != 3) {
        return;
      }
      *_woffset = *param_data;
      *_hoffset = param_data[1];
      lVar6 = 0x14;
      lVar4 = 0x10;
      lVar3 = 0xc;
      piVar2 = _outh;
      piVar5 = _outc;
      _hoffset = _outw;
      piVar7 = param_data + 2;
    }
    _outw = piVar5;
    *_coffset = *piVar7;
    *_hoffset = *(int *)((long)param_data + lVar3);
    piVar5 = (int *)(lVar4 + (long)param_data);
    _woffset = piVar2;
    lVar4 = lVar6;
  }
  *_woffset = *piVar5;
  *_outw = *(int *)((long)param_data + lVar4);
  return;
}

Assistant:

void Crop::resolve_crop_roi(const Mat& bottom_blob, const int* param_data, int& _woffset, int& _hoffset, int& _coffset, int& _outw, int& _outh, int& _outc) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        _woffset = param_data[0];
        _outw = param_data[3];
    }
    if (dims == 2)
    {
        _woffset = param_data[0];
        _hoffset = param_data[1];
        _outw = param_data[3];
        _outh = param_data[4];
    }
    if (dims == 3)
    {
        _woffset = param_data[0];
        _hoffset = param_data[1];
        _coffset = param_data[2];
        _outw = param_data[3];
        _outh = param_data[4];
        _outc = param_data[5];
    }
}